

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::anon_unknown_36::WebSocketImpl::sendCloseDueToError
          (WebSocketImpl *this,uint16_t code,StringPtr reason)

{
  WeakFulfillerBase *pWVar1;
  bool bVar2;
  PromiseFulfiller<void> *pPVar3;
  Disposer *pDVar4;
  uchar *puVar5;
  size_t sVar6;
  ArrayDisposer *pAVar7;
  PromiseArena *pPVar8;
  OwnPromiseNode OVar9;
  long *plVar10;
  PromiseBase PVar11;
  WeakFulfiller<void> *params;
  void *pvVar12;
  TransformPromiseNodeBase *this_00;
  undefined6 in_register_00000032;
  WebSocketImpl *this_01;
  PromiseArena *in_R8;
  StringPtr reason_00;
  Array<unsigned_char> payload;
  OwnPromiseNode local_d0;
  WeakFulfillerBase *local_c8;
  long *local_c0;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_b8;
  Array<unsigned_char> local_a8;
  PromiseBase local_90;
  Array<unsigned_char> local_88;
  ControlMessage local_70;
  WeakFulfillerBase *local_40;
  PromiseArena *local_38;
  
  this_01 = (WebSocketImpl *)CONCAT62(in_register_00000032,code);
  local_90.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  local_38 = in_R8;
  params = (WeakFulfiller<void> *)operator_new(0x18);
  pWVar1 = &params->super_WeakFulfillerBase;
  (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (params->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_006e1308;
  (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_006e1340;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
            ((PromiseDisposer *)&local_70,params);
  local_d0.ptr = (PromiseNode *)local_70._0_8_;
  local_c0 = (long *)0x0;
  bVar2 = (this_01->queuedControlMessage).ptr.isSet;
  reason_00.content.size_ = (size_t)in_R8;
  reason_00.content.ptr = (char *)local_38;
  local_c8 = pWVar1;
  local_40 = pWVar1;
  serializeClose(&local_a8,(WebSocketImpl *)(ulong)(uint)reason.content.ptr,
                 (uint16_t)reason.content.size_,reason_00);
  local_88.ptr = local_a8.ptr;
  local_88.size_ = local_a8.size_;
  local_88.disposer = local_a8.disposer;
  local_a8.ptr = (uchar *)0x0;
  local_a8.size_ = 0;
  local_b8.ptr.disposer = &pWVar1->super_Disposer;
  local_b8.ptr.ptr = (PromiseFulfiller<void> *)params;
  ControlMessage::ControlMessage(&local_70,'\b',&local_88,&local_b8);
  if ((this_01->queuedControlMessage).ptr.isSet == true) {
    (this_01->queuedControlMessage).ptr.isSet = false;
    pPVar3 = (this_01->queuedControlMessage).ptr.field_1.value.fulfiller.ptr.ptr;
    if (pPVar3 != (PromiseFulfiller<void> *)0x0) {
      (this_01->queuedControlMessage).ptr.field_1.value.fulfiller.ptr.ptr =
           (PromiseFulfiller<void> *)0x0;
      pDVar4 = (this_01->queuedControlMessage).ptr.field_1.value.fulfiller.ptr.disposer;
      (**pDVar4->_vptr_Disposer)
                (pDVar4,(_func_int *)
                        ((long)&(pPVar3->super_PromiseRejector)._vptr_PromiseRejector +
                        (long)(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[-2]));
    }
    puVar5 = (this_01->queuedControlMessage).ptr.field_1.value.payload.ptr;
    if (puVar5 != (uchar *)0x0) {
      sVar6 = (this_01->queuedControlMessage).ptr.field_1.value.payload.size_;
      (this_01->queuedControlMessage).ptr.field_1.value.payload.ptr = (uchar *)0x0;
      (this_01->queuedControlMessage).ptr.field_1.value.payload.size_ = 0;
      pAVar7 = (this_01->queuedControlMessage).ptr.field_1.value.payload.disposer;
      (**pAVar7->_vptr_ArrayDisposer)(pAVar7,puVar5,1,sVar6,sVar6,0);
    }
  }
  pPVar3 = local_b8.ptr.ptr;
  (this_01->queuedControlMessage).ptr.field_1.value.opcode = local_70.opcode;
  (this_01->queuedControlMessage).ptr.field_1.value.payload.ptr = local_70.payload.ptr;
  (this_01->queuedControlMessage).ptr.field_1.value.payload.size_ = local_70.payload.size_;
  (this_01->queuedControlMessage).ptr.field_1.value.payload.disposer = local_70.payload.disposer;
  (this_01->queuedControlMessage).ptr.field_1.value.fulfiller.ptr.disposer =
       local_70.fulfiller.ptr.disposer;
  (this_01->queuedControlMessage).ptr.field_1.value.fulfiller.ptr.ptr = local_70.fulfiller.ptr.ptr;
  (this_01->queuedControlMessage).ptr.isSet = true;
  local_70.fulfiller.ptr.ptr = (PromiseFulfiller<void> *)0x0;
  local_70.payload.size_ = 0;
  local_70.payload.ptr = (uchar *)0x0;
  if ((WeakFulfiller<void> *)local_b8.ptr.ptr != (WeakFulfiller<void> *)0x0) {
    local_b8.ptr.ptr = (PromiseFulfiller<void> *)0x0;
    (**((Disposer *)&(local_b8.ptr.disposer)->_vptr_Disposer)->_vptr_Disposer)
              (local_b8.ptr.disposer,
               (_func_int *)
               ((long)&(((PromiseFulfiller<void> *)&pPVar3->super_PromiseRejector)->
                       super_PromiseRejector)._vptr_PromiseRejector +
               (long)(((PromiseFulfiller<void> *)&pPVar3->super_PromiseRejector)->
                     super_PromiseRejector)._vptr_PromiseRejector[-2]));
  }
  sVar6 = local_88.size_;
  puVar5 = local_88.ptr;
  if (local_88.ptr != (uchar *)0x0) {
    local_88.ptr = (uchar *)0x0;
    local_88.size_ = 0;
    (**(local_88.disposer)->_vptr_ArrayDisposer)(local_88.disposer,puVar5,1,sVar6,sVar6,0);
  }
  if (bVar2 == false) {
    setUpSendingControlMessage(this_01);
  }
  sVar6 = local_a8.size_;
  puVar5 = local_a8.ptr;
  if (local_a8.ptr != (uchar *)0x0) {
    local_a8.ptr = (uchar *)0x0;
    local_a8.size_ = 0;
    (**(local_a8.disposer)->_vptr_ArrayDisposer)(local_a8.disposer,puVar5,1,sVar6,sVar6,0);
  }
  OVar9.ptr = local_d0.ptr;
  pPVar8 = ((local_d0.ptr)->super_PromiseArenaMember).arena;
  if (pPVar8 == (PromiseArena *)0x0 || (ulong)((long)local_d0.ptr - (long)pPVar8) < 0x40) {
    pvVar12 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar12 + 0x3c0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_d0,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3620:29)>
               ::anon_class_32_3_b9a24fbc_for_func::operator());
    *(undefined ***)((long)pvVar12 + 0x3c0) = &PTR_destroy_00702d38;
    *(WebSocketImpl **)((long)pvVar12 + 0x3e0) = this_01;
    *(short *)((long)pvVar12 + 1000) = (short)reason.content.ptr;
    *(_func_int ***)((long)pvVar12 + 0x3f0) = (_func_int **)reason.content.size_;
    *(PromiseArena **)((long)pvVar12 + 0x3f8) = local_38;
    *(void **)((long)pvVar12 + 0x3c8) = pvVar12;
  }
  else {
    ((local_d0.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_d0.ptr + -4);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_d0,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3620:29)>
               ::anon_class_32_3_b9a24fbc_for_func::operator());
    OVar9.ptr[-4].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_00702d38;
    OVar9.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)this_01;
    *(short *)&OVar9.ptr[-2].super_PromiseArenaMember.arena = (short)reason.content.ptr;
    OVar9.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)reason.content.size_;
    OVar9.ptr[-1].super_PromiseArenaMember.arena = local_38;
    OVar9.ptr[-4].super_PromiseArenaMember.arena = pPVar8;
  }
  PVar11.node.ptr = local_90.node.ptr;
  local_70._0_8_ = &DAT_005053bd;
  local_70.payload.ptr = "then";
  local_70.payload.size_ = 0x4c0000058b;
  local_88.ptr = (uchar *)this_00;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_a8,(OwnPromiseNode *)&local_88,(SourceLocation *)&local_70);
  puVar5 = local_88.ptr;
  *(uchar **)PVar11.node.ptr = local_a8.ptr;
  if ((TransformPromiseNodeBase *)local_88.ptr != (TransformPromiseNodeBase *)0x0) {
    local_88.ptr = (uchar *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)puVar5);
  }
  plVar10 = local_c0;
  if (local_c0 != (long *)0x0) {
    local_c0 = (long *)0x0;
    (**(local_c8->super_Disposer)._vptr_Disposer)
              (local_c8,(long)plVar10 + *(long *)(*plVar10 + -0x10));
  }
  OVar9.ptr = local_d0.ptr;
  if (&(local_d0.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_d0.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar9.ptr)->super_PromiseArenaMember);
  }
  return (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>)
         (PromiseNode *)PVar11.node.ptr;
}

Assistant:

kj::Promise<Message> sendCloseDueToError(uint16_t code, kj::StringPtr reason){
    auto paf = newPromiseAndFulfiller<void>();
    queueClose(code, reason, kj::mv(paf.fulfiller));

    return paf.promise.then([this, code, reason]() -> kj::Promise<Message> {
        return errorHandler.handleWebSocketProtocolError({
            code, reason
          });
      });
  }